

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void __thiscall Reader::processsections(Reader *this)

{
  processnonesec(this);
  processobjsec(this);
  processconsec(this);
  processboundssec(this);
  processgensec(this);
  processbinsec(this);
  processsemisec(this);
  processsossec(this);
  processendsec(this);
  return;
}

Assistant:

void Reader::processsections() {
  processnonesec();
  processobjsec();
  processconsec();
  processboundssec();
  processgensec();
  processbinsec();
  processsemisec();
  processsossec();
  processendsec();
}